

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O0

int Pdr_ManCountVariables(Pdr_Man_t *p,int kStart)

{
  int iVar1;
  Vec_Ptr_t *vCubes_00;
  int local_34;
  int Counter;
  int Entry;
  int i;
  Vec_Ptr_t *vCubes;
  Vec_Int_t *vFlopCounts;
  Pdr_Man_t *pPStack_10;
  int kStart_local;
  Pdr_Man_t *p_local;
  
  local_34 = 0;
  vFlopCounts._4_4_ = kStart;
  pPStack_10 = p;
  vCubes_00 = Pdr_ManCollectCubes(p,kStart);
  vCubes = (Vec_Ptr_t *)Pdr_ManCountFlops(pPStack_10,vCubes_00);
  for (Counter = 0; iVar1 = Vec_IntSize((Vec_Int_t *)vCubes), Counter < iVar1; Counter = Counter + 1
      ) {
    iVar1 = Vec_IntEntry((Vec_Int_t *)vCubes,Counter);
    local_34 = (uint)(0 < iVar1) + local_34;
  }
  Vec_IntFreeP((Vec_Int_t **)&vCubes);
  Vec_PtrFree(vCubes_00);
  return local_34;
}

Assistant:

int Pdr_ManCountVariables( Pdr_Man_t * p, int kStart )
{
    Vec_Int_t * vFlopCounts;
    Vec_Ptr_t * vCubes;
    int i, Entry, Counter = 0;
    vCubes = Pdr_ManCollectCubes( p, kStart );
    vFlopCounts = Pdr_ManCountFlops( p, vCubes );
    Vec_IntForEachEntry( vFlopCounts, Entry, i )
        Counter += (Entry > 0);
    Vec_IntFreeP( &vFlopCounts );
    Vec_PtrFree( vCubes );
    return Counter;
}